

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Tag::Clear(Tag *this)

{
  SimpleTag *pSVar1;
  uint uVar2;
  
  while( true ) {
    pSVar1 = this->simple_tags_;
    if (this->simple_tags_count_ < 1) break;
    uVar2 = this->simple_tags_count_ - 1;
    this->simple_tags_count_ = uVar2;
    SimpleTag::Clear(pSVar1 + uVar2);
  }
  if (pSVar1 != (SimpleTag *)0x0) {
    operator_delete__(pSVar1);
  }
  this->simple_tags_ = (SimpleTag *)0x0;
  this->simple_tags_size_ = 0;
  return;
}

Assistant:

void Tag::Clear() {
  while (simple_tags_count_ > 0) {
    SimpleTag& st = simple_tags_[--simple_tags_count_];
    st.Clear();
  }

  delete[] simple_tags_;
  simple_tags_ = NULL;

  simple_tags_size_ = 0;
}